

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

Texture2D * LoadTexture(Texture2D *__return_storage_ptr__,char *fileName)

{
  Image image_00;
  undefined8 unaff_RBX;
  Image image;
  void *local_28;
  undefined8 in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  
  __return_storage_ptr__->id = 0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->mipmaps = 0;
  __return_storage_ptr__->format = 0;
  LoadImage((Image *)&local_28,fileName);
  if (local_28 != (void *)0x0) {
    image_00.width = (int)in_stack_ffffffffffffffe8;
    image_00.height = SUB84(in_stack_ffffffffffffffe8,4);
    image_00.data = (void *)in_stack_ffffffffffffffe0;
    image_00.mipmaps = (int)unaff_RBX;
    image_00.format = (int)((ulong)unaff_RBX >> 0x20);
    LoadTextureFromImage(image_00);
    free(local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

Texture2D LoadTexture(const char *fileName)
{
    Texture2D texture = { 0 };

    Image image = LoadImage(fileName);

    if (image.data != NULL)
    {
        texture = LoadTextureFromImage(image);
        UnloadImage(image);
    }

    return texture;
}